

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O3

void __thiscall
TEST_JUnitOutputTest_UTPRINTOutputInJUnitOutput_TestShell::
~TEST_JUnitOutputTest_UTPRINTOutputInJUnitOutput_TestShell
          (TEST_JUnitOutputTest_UTPRINTOutputInJUnitOutput_TestShell *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(JUnitOutputTest, UTPRINTOutputInJUnitOutput)
{
    testCaseRunner->start()
            .withGroup("groupname")
            .withTest("testname").thatPrints("someoutput")
            .end();

    outputFile = fileSystem.file("cpputest_groupname.xml");
    STRCMP_EQUAL("<system-out>someoutput</system-out>\n", outputFile->lineFromTheBack(3));
}